

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool CheckBlockHeader(CBlockHeader *block,BlockValidationState *state,Params *consensusParams,
                     bool fCheckPOW)

{
  long lVar1;
  uint256 hash;
  bool bVar2;
  byte bVar3;
  byte in_CL;
  undefined8 in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  CBlockHeader *in_stack_ffffffffffffff38;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff46;
  undefined1 in_stack_ffffffffffffff47;
  undefined8 in_stack_ffffffffffffff48;
  uint nBits;
  allocator<char> *__a;
  char *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  undefined5 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff95;
  unkbyte10 in_stack_ffffffffffffff96;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  string *local_20;
  string *local_18;
  undefined8 local_10;
  BlockValidationResult BStack_c;
  
  nBits = (uint)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_CL & 1) != 0) {
    CBlockHeader::GetHash(in_stack_ffffffffffffff38);
    hash.super_base_blob<256U>.m_data._M_elems[8] = (char)in_RDI;
    hash.super_base_blob<256U>.m_data._M_elems[9] = (char)((ulong)in_RDI >> 8);
    hash.super_base_blob<256U>.m_data._M_elems[10] = (char)((ulong)in_RDI >> 0x10);
    hash.super_base_blob<256U>.m_data._M_elems[0xb] = (char)((ulong)in_RDI >> 0x18);
    hash.super_base_blob<256U>.m_data._M_elems[0xc] = (char)((ulong)in_RDI >> 0x20);
    hash.super_base_blob<256U>.m_data._M_elems[0xd] = (char)((ulong)in_RDI >> 0x28);
    hash.super_base_blob<256U>.m_data._M_elems[0xe] = (char)((ulong)in_RDI >> 0x30);
    hash.super_base_blob<256U>.m_data._M_elems[0xf] = (char)((ulong)in_RDI >> 0x38);
    hash.super_base_blob<256U>.m_data._M_elems[0] = (char)in_RSI;
    hash.super_base_blob<256U>.m_data._M_elems[1] = (char)((ulong)in_RSI >> 8);
    hash.super_base_blob<256U>.m_data._M_elems[2] = (char)((ulong)in_RSI >> 0x10);
    hash.super_base_blob<256U>.m_data._M_elems[3] = (char)((ulong)in_RSI >> 0x18);
    hash.super_base_blob<256U>.m_data._M_elems[4] = (char)((ulong)in_RSI >> 0x20);
    hash.super_base_blob<256U>.m_data._M_elems[5] = (char)((ulong)in_RSI >> 0x28);
    hash.super_base_blob<256U>.m_data._M_elems[6] = (char)((ulong)in_RSI >> 0x30);
    hash.super_base_blob<256U>.m_data._M_elems[7] = (char)((ulong)in_RSI >> 0x38);
    hash.super_base_blob<256U>.m_data._M_elems[0x10] = (char)in_stack_ffffffffffffff90;
    hash.super_base_blob<256U>.m_data._M_elems[0x11] = (char)((uint5)in_stack_ffffffffffffff90 >> 8)
    ;
    hash.super_base_blob<256U>.m_data._M_elems[0x12] =
         (char)((uint5)in_stack_ffffffffffffff90 >> 0x10);
    hash.super_base_blob<256U>.m_data._M_elems[0x13] =
         (char)((uint5)in_stack_ffffffffffffff90 >> 0x18);
    hash.super_base_blob<256U>.m_data._M_elems[0x14] =
         (char)((uint5)in_stack_ffffffffffffff90 >> 0x20);
    hash.super_base_blob<256U>.m_data._M_elems[0x15] = in_stack_ffffffffffffff95;
    hash.super_base_blob<256U>.m_data._M_elems[0x16] = (char)in_stack_ffffffffffffff96;
    hash.super_base_blob<256U>.m_data._M_elems[0x17] =
         (char)((unkuint10)in_stack_ffffffffffffff96 >> 8);
    hash.super_base_blob<256U>.m_data._M_elems[0x18] =
         (char)((unkuint10)in_stack_ffffffffffffff96 >> 0x10);
    hash.super_base_blob<256U>.m_data._M_elems[0x19] =
         (char)((unkuint10)in_stack_ffffffffffffff96 >> 0x18);
    hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
         (char)((unkuint10)in_stack_ffffffffffffff96 >> 0x20);
    hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
         (char)((unkuint10)in_stack_ffffffffffffff96 >> 0x28);
    hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
         (char)((unkuint10)in_stack_ffffffffffffff96 >> 0x30);
    hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
         (char)((unkuint10)in_stack_ffffffffffffff96 >> 0x38);
    hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
         (char)((unkuint10)in_stack_ffffffffffffff96 >> 0x40);
    hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
         (char)((unkuint10)in_stack_ffffffffffffff96 >> 0x48);
    bVar2 = CheckProofOfWork(hash,nBits,
                             (Params *)
                             CONCAT17(in_stack_ffffffffffffff47,
                                      CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40))
                            );
    if (!bVar2) {
      __a = (allocator<char> *)&stack0xffffffffffffff97;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,__a);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,__a);
      bVar3 = ValidationState<BlockValidationResult>::Invalid
                        ((ValidationState<BlockValidationResult> *)in_stack_ffffffffffffff38,
                         BStack_c,local_18,local_20);
      std::__cxx11::string::~string(local_28);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff96);
      std::__cxx11::string::~string(local_28);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
      goto LAB_0149cdec;
    }
  }
  bVar3 = 1;
LAB_0149cdec:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar3 & 1);
  }
  __stack_chk_fail();
}

Assistant:

static bool CheckBlockHeader(const CBlockHeader& block, BlockValidationState& state, const Consensus::Params& consensusParams, bool fCheckPOW = true)
{
    // Check proof of work matches claimed amount
    if (fCheckPOW && !CheckProofOfWork(block.GetHash(), block.nBits, consensusParams))
        return state.Invalid(BlockValidationResult::BLOCK_INVALID_HEADER, "high-hash", "proof of work failed");

    return true;
}